

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O0

compressed_lower_distance_matrix * read_dipha(istream *input_stream)

{
  long lVar1;
  ostream *poVar2;
  compressed_lower_distance_matrix *in_RDI;
  value_type_conflict1 *__x;
  int j;
  int i;
  vector<float,_std::allocator<float>_> distances;
  index_t n;
  compressed_lower_distance_matrix *s;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffb0;
  int local_38;
  int local_34;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffd8;
  compressed_distance_matrix<(compressed_matrix_layout)0> *in_stack_ffffffffffffffe0;
  
  s = in_RDI;
  lVar1 = read<long>((istream *)in_RDI);
  if (lVar1 != 0x1e0d74600) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "input is not a Dipha file (magic number: 8067171840)");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  lVar1 = read<long>((istream *)s);
  if (lVar1 != 7) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "input is not a Dipha distance matrix (file type: 7)");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  lVar1 = read<long>((istream *)s);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x14b454);
  for (local_34 = 0; local_34 < (int)lVar1; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < (int)lVar1; local_38 = local_38 + 1) {
      if (local_38 < local_34) {
        __x = (value_type_conflict1 *)read<double>((istream *)s);
        std::vector<float,_std::allocator<float>_>::push_back(&s->distances,__x);
      }
      else {
        read<double>((istream *)s);
      }
    }
  }
  compressed_distance_matrix<(compressed_matrix_layout)0>::compressed_distance_matrix
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffffb0);
  return in_RDI;
}

Assistant:

compressed_lower_distance_matrix read_dipha(std::istream& input_stream) {
	if (read<int64_t>(input_stream) != 8067171840) {
		std::cerr << "input is not a Dipha file (magic number: 8067171840)" << std::endl;
		exit(-1);
	}

	if (read<int64_t>(input_stream) != 7) {
		std::cerr << "input is not a Dipha distance matrix (file type: 7)" << std::endl;
		exit(-1);
	}

	index_t n = index_t(read<int64_t>(input_stream));

	std::vector<value_t> distances;

	for (int i = 0; i < n; ++i)
		for (int j = 0; j < n; ++j)
			if (i > j)
				distances.push_back(value_t(read<double>(input_stream)));
			else
				read<double>(input_stream);

	return compressed_lower_distance_matrix(std::move(distances));
}